

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::SeekHead::ParseEntry
               (IMkvReader *pReader,longlong start,longlong size_,Entry *pEntry)

{
  longlong lVar1;
  longlong lVar2;
  longlong seekPosSize;
  longlong seekPosId;
  longlong seekIdSize;
  longlong seekIdId;
  long len;
  longlong stop;
  longlong pos;
  Entry *pEntry_local;
  longlong size__local;
  longlong start_local;
  IMkvReader *pReader_local;
  
  if (size_ < 1) {
    pReader_local._7_1_ = false;
  }
  else {
    len = start + size_;
    stop = start;
    pos = (longlong)pEntry;
    pEntry_local = (Entry *)size_;
    size__local = start;
    start_local = (longlong)pReader;
    lVar1 = ReadID(pReader,start,&seekIdId);
    if (lVar1 < 0) {
      pReader_local._7_1_ = false;
    }
    else if (lVar1 == 0x53ab) {
      if (len < stop + seekIdId) {
        pReader_local._7_1_ = false;
      }
      else {
        stop = seekIdId + stop;
        lVar1 = ReadUInt((IMkvReader *)start_local,stop,&seekIdId);
        if (lVar1 < 1) {
          pReader_local._7_1_ = false;
        }
        else if (len < stop + seekIdId) {
          pReader_local._7_1_ = false;
        }
        else {
          stop = seekIdId + stop;
          if (len < stop + lVar1) {
            pReader_local._7_1_ = false;
          }
          else {
            lVar2 = ReadID((IMkvReader *)start_local,stop,&seekIdId);
            *(longlong *)pos = lVar2;
            if (*(long *)pos < 1) {
              pReader_local._7_1_ = false;
            }
            else if (seekIdId == lVar1) {
              stop = lVar1 + stop;
              lVar1 = ReadID((IMkvReader *)start_local,stop,&seekIdId);
              if (lVar1 == 0x53ac) {
                if (len < stop + seekIdId) {
                  pReader_local._7_1_ = false;
                }
                else {
                  stop = seekIdId + stop;
                  lVar1 = ReadUInt((IMkvReader *)start_local,stop,&seekIdId);
                  if (lVar1 < 1) {
                    pReader_local._7_1_ = false;
                  }
                  else if (len < stop + seekIdId) {
                    pReader_local._7_1_ = false;
                  }
                  else {
                    stop = seekIdId + stop;
                    if (len < stop + lVar1) {
                      pReader_local._7_1_ = false;
                    }
                    else {
                      lVar2 = UnserializeUInt((IMkvReader *)start_local,stop,lVar1);
                      *(longlong *)(pos + 8) = lVar2;
                      if (*(long *)(pos + 8) < 0) {
                        pReader_local._7_1_ = false;
                      }
                      else if (lVar1 + stop == len) {
                        pReader_local._7_1_ = true;
                      }
                      else {
                        pReader_local._7_1_ = false;
                      }
                    }
                  }
                }
              }
              else {
                pReader_local._7_1_ = false;
              }
            }
            else {
              pReader_local._7_1_ = false;
            }
          }
        }
      }
    }
    else {
      pReader_local._7_1_ = false;
    }
  }
  return pReader_local._7_1_;
}

Assistant:

bool SeekHead::ParseEntry(IMkvReader* pReader, long long start, long long size_,
                          Entry* pEntry) {
  if (size_ <= 0)
    return false;

  long long pos = start;
  const long long stop = start + size_;

  long len;

  // parse the container for the level-1 element ID

  const long long seekIdId = ReadID(pReader, pos, len);
  if (seekIdId < 0)
    return false;

  if (seekIdId != libwebm::kMkvSeekID)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume SeekID id

  const long long seekIdSize = ReadUInt(pReader, pos, len);

  if (seekIdSize <= 0)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume size of field

  if ((pos + seekIdSize) > stop)
    return false;

  pEntry->id = ReadID(pReader, pos, len);  // payload

  if (pEntry->id <= 0)
    return false;

  if (len != seekIdSize)
    return false;

  pos += seekIdSize;  // consume SeekID payload

  const long long seekPosId = ReadID(pReader, pos, len);

  if (seekPosId != libwebm::kMkvSeekPosition)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume id

  const long long seekPosSize = ReadUInt(pReader, pos, len);

  if (seekPosSize <= 0)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume size

  if ((pos + seekPosSize) > stop)
    return false;

  pEntry->pos = UnserializeUInt(pReader, pos, seekPosSize);

  if (pEntry->pos < 0)
    return false;

  pos += seekPosSize;  // consume payload

  if (pos != stop)
    return false;

  return true;
}